

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestPlatform.cpp
# Opt level: O0

long TimeInMillisImplementation(void)

{
  timezone local_20;
  timezone tz;
  timeval tv;
  
  gettimeofday((timeval *)&tz,&local_20);
  return (long)tz * 1000 + (long)((double)tv.tv_sec * 0.001);
}

Assistant:

static long TimeInMillisImplementation()
{
#ifdef CPPUTEST_HAVE_GETTIMEOFDAY
    struct timeval tv;
    struct timezone tz;
    gettimeofday(&tv, &tz);
    return (long)((tv.tv_sec * 1000) + (time_t)((double)tv.tv_usec * 0.001));
#else
    return 0;
#endif
}